

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void __thiscall
Js::JavascriptNativeIntArray::JavascriptNativeIntArray
          (JavascriptNativeIntArray *this,DynamicType *type,uint32 size)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined1 auVar9 [16];
  long lVar10;
  undefined1 in_XMM4 [16];
  undefined1 auVar11 [16];
  
  JavascriptArray::JavascriptArray((JavascriptArray *)this,type);
  (this->super_JavascriptNativeArray).weakRefToFuncBody.ptr =
       (RecyclerWeakReference<Js::FunctionBody> *)0x0;
  (this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_014f6fc8;
  if (((undefined **)VirtualTableInfo<Js::JavascriptNativeIntArray>::Address !=
       &PTR_Finalize_014f6fc8) &&
     ((undefined **)VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address !=
      &PTR_Finalize_014f6fc8)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                ,0x76c,
                                "(VirtualTableInfo<T>::HasVirtualTable(array) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(array))"
                                ,
                                "VirtualTableInfo<T>::HasVirtualTable(array) || VirtualTableInfo<CrossSiteObject<T>>::HasVirtualTable(array)"
                               );
    if (!bVar4) goto LAB_00b6a4a5;
    *puVar5 = 0;
  }
  pDVar6 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  if (pDVar6->inlineSlotCapacity != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_00;
    in_XMM1._0_8_ = extraout_XMM1_Qa_00;
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.inl"
                                ,0x770,
                                "(UseDynamicInlinePropertySlots || ConstInlinePropertySlots == array->GetTypeHandler()->GetInlineSlotCapacity())"
                                ,
                                "UseDynamicInlinePropertySlots || ConstInlinePropertySlots == array->GetTypeHandler()->GetInlineSlotCapacity()"
                               );
    if (!bVar4) {
LAB_00b6a4a5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  JavascriptArray::SetHeadAndLastUsedSegment
            ((JavascriptArray *)this,(SparseArraySegmentBase *)(this + 1));
  pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  pSVar1->size = size;
  SparseArraySegmentBase::CheckLengthvsSize(pSVar1);
  auVar3 = _DAT_00fa8550;
  pSVar1 = (this->super_JavascriptNativeArray).super_JavascriptArray.head.ptr;
  if (1 < size) {
    lVar7 = (ulong)(size >> 1) - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar9 = pmovsxbq(in_XMM1,0x100);
    lVar7 = 0;
    auVar8 = auVar8 ^ _DAT_00fa8550;
    auVar11 = pmovsxbq(in_XMM4,0x202);
    do {
      if ((bool)(~(auVar8._0_8_ < SUB168(auVar9 ^ auVar3,0)) & 1)) {
        *(undefined1 **)((long)&pSVar1[1].left + lVar7) = &DAT_fff80002fff80002;
      }
      if (SUB168(auVar9 ^ auVar3,8) <= auVar8._8_8_) {
        *(undefined1 **)((long)&pSVar1[1].size + lVar7) = &DAT_fff80002fff80002;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + auVar11._0_8_;
      auVar9._8_8_ = lVar10 + auVar11._8_8_;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)((size >> 1) + 1 & 0xfffffffe) << 3 != lVar7);
  }
  if ((size & 0xfffffffe) != size) {
    (&pSVar1[1].left)[size & 0xfffffffe] = 0xfff80002;
  }
  return;
}

Assistant:

JavascriptNativeIntArray::JavascriptNativeIntArray(DynamicType * type, uint32 size)
        : JavascriptNativeArray(type)
    {
        SetHeadAndLastUsedSegment(DetermineInlineHeadSegmentPointer<JavascriptNativeIntArray, 0, false>(this));
        head->size = size;
        head->CheckLengthvsSize();
        SparseArraySegment<int32>::From(head)->FillSegmentBuffer(0, size);
    }